

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O3

void beltMACStart(void *state,octet *key,size_t len)

{
  beltKeyExpand2((u32 *)state,key,len);
  *(undefined8 *)((long)state + 0x30) = 0;
  *(undefined8 *)((long)state + 0x38) = 0;
  *(undefined8 *)((long)state + 0x20) = 0;
  *(undefined8 *)((long)state + 0x28) = 0;
  beltBlockEncr2((u32 *)((long)state + 0x30),(u32 *)state);
  *(undefined8 *)((long)state + 0x60) = 0;
  return;
}

Assistant:

void beltMACStart(void* state, const octet key[], size_t len)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(memIsValid(state, beltMAC_keep()));
	beltKeyExpand2(st->key, key, len);
	beltBlockSetZero(st->s);
	beltBlockSetZero(st->r);
	beltBlockEncr2(st->r, st->key);
	st->filled = 0;
}